

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_t.hpp
# Opt level: O2

bool nlohmann::detail::operator<(value_t lhs,value_t rhs)

{
  if (rhs < discarded && lhs < discarded) {
    return operator<::order._M_elems[lhs] < operator<::order._M_elems[rhs];
  }
  return false;
}

Assistant:

inline bool operator<(const value_t lhs, const value_t rhs) noexcept
{
    static constexpr std::array<std::uint8_t, 9> order = {{
            0 /* null */, 3 /* object */, 4 /* array */, 5 /* string */,
            1 /* boolean */, 2 /* integer */, 2 /* unsigned */, 2 /* float */,
            6 /* binary */
        }
    };

    const auto l_index = static_cast<std::size_t>(lhs);
    const auto r_index = static_cast<std::size_t>(rhs);
    return l_index < order.size() && r_index < order.size() && order[l_index] < order[r_index];
}